

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::GenerateMembers
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  int iVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  WrapperFieldGenerator *this_00;
  Options *pOVar4;
  FieldGeneratorBase *pFVar5;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> single_generator;
  
  variables = &(this->super_FieldGeneratorBase).variables_;
  io::Printer::Print(printer,variables,
                     "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n    = "
                    );
  bVar3 = IsWrapperType((this->super_FieldGeneratorBase).descriptor_);
  if (bVar3) {
    this_00 = (WrapperFieldGenerator *)operator_new(0x60);
    pFVar2 = (this->super_FieldGeneratorBase).descriptor_;
    iVar1 = (this->super_FieldGeneratorBase).fieldOrdinal_;
    pOVar4 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    WrapperFieldGenerator::WrapperFieldGenerator(this_00,pFVar2,iVar1,pOVar4);
    single_generator.ptr_ = (FieldGeneratorBase *)this_00;
    pFVar5 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&single_generator);
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar5,printer);
  }
  else {
    pFVar5 = (FieldGeneratorBase *)operator_new(0x58);
    pFVar2 = (this->super_FieldGeneratorBase).descriptor_;
    iVar1 = (this->super_FieldGeneratorBase).fieldOrdinal_;
    pOVar4 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    MessageFieldGenerator::MessageFieldGenerator
              ((MessageFieldGenerator *)pFVar5,pFVar2,iVar1,pOVar4);
    single_generator.ptr_ = pFVar5;
    pFVar5 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&single_generator);
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar5,printer);
  }
  if (single_generator.ptr_ != (FieldGeneratorBase *)0x0) {
    (*((single_generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
  }
  io::Printer::Print(printer,";\n");
  io::Printer::Print(printer,variables,
                     "private readonly pbc::RepeatedField<$type_name$> $name$_ = new pbc::RepeatedField<$type_name$>();\n"
                    );
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  io::Printer::Print(printer,variables,
                     "$access_level$ pbc::RepeatedField<$type_name$> $property_name$ {\n  get { return $name$_; }\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::GenerateMembers(io::Printer* printer) {
  printer->Print(
    variables_,
    "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n"
    "    = ");
  // Don't want to duplicate the codec code here... maybe we should have a
  // "create single field generator for this repeated field"
  // function, but it doesn't seem worth it for just this.
  if (IsWrapperType(descriptor_)) {
    scoped_ptr<FieldGeneratorBase> single_generator(
      new WrapperFieldGenerator(descriptor_, fieldOrdinal_, this->options()));
    single_generator->GenerateCodecCode(printer);
  } else {
    scoped_ptr<FieldGeneratorBase> single_generator(
      new MessageFieldGenerator(descriptor_, fieldOrdinal_, this->options()));
    single_generator->GenerateCodecCode(printer);
  }
  printer->Print(";\n");
  printer->Print(
    variables_,
    "private readonly pbc::RepeatedField<$type_name$> $name$_ = new pbc::RepeatedField<$type_name$>();\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ pbc::RepeatedField<$type_name$> $property_name$ {\n"
    "  get { return $name$_; }\n"
    "}\n");
}